

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O2

void __thiscall CMakeScanner::CMakeScanner(CMakeScanner *this)

{
  int iVar1;
  runtime_error *this_00;
  
  this->yyscanner = (yyscan_t)0x0;
  ScannerCtx::ScannerCtx(&this->scannerCtx);
  this->file = (FILE *)0x0;
  this->stringBuf = (YY_BUFFER_STATE)0x0;
  iVar1 = yylex_init(&this->yyscanner);
  if (iVar1 == 0) {
    iVar1 = yylex_init_extra(&this->scannerCtx,&this->yyscanner);
    if (iVar1 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"yylex_init_extra() error");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"yylex_init() error");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CMakeScanner()
    {
        if(yylex_init(&yyscanner))
        {
            throw std::runtime_error{"yylex_init() error"};
        }

        if(yylex_init_extra(&scannerCtx, &yyscanner))
        {
            throw std::runtime_error{"yylex_init_extra() error"};
        }
    }